

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall DIntermissionController::Destroy(DIntermissionController *this)

{
  FIntermissionDescriptor *pFVar1;
  DIntermissionScreen *pDVar2;
  
  DObject::Destroy(&this->super_DObject);
  pDVar2 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)&this->mScreen);
  if (pDVar2 != (DIntermissionScreen *)0x0) {
    pDVar2 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)&this->mScreen);
    (*(pDVar2->super_DObject)._vptr_DObject[4])(pDVar2);
  }
  if (this->mDeleteDesc == true) {
    pFVar1 = this->mDesc;
    if (pFVar1 != (FIntermissionDescriptor *)0x0) {
      TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
                (&pFVar1->mActions);
    }
    operator_delete(pFVar1,0x18);
  }
  this->mDesc = (FIntermissionDescriptor *)0x0;
  if (CurrentIntermission == this) {
    CurrentIntermission = (DIntermissionController *)0x0;
  }
  return;
}

Assistant:

void DIntermissionController::Destroy ()
{
	Super::Destroy();
	if (mScreen != NULL) mScreen->Destroy();
	if (mDeleteDesc) delete mDesc;
	mDesc = NULL;
	if (CurrentIntermission == this) CurrentIntermission = NULL;
}